

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFrameworkPath_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  char local_19;
  static_string_view local_18;
  
  if ((this->Directory)._M_string_length == 0) {
    local_18.super_string_view._M_len = 10;
    local_18.super_string_view._M_str = ".framework";
    cmStrCat<std::__cxx11::string_const&,cm::static_string_view>
              (__return_storage_ptr__,&this->Name,&local_18);
  }
  else {
    local_19 = '/';
    local_18.super_string_view._M_len = 10;
    local_18.super_string_view._M_str = ".framework";
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,cm::static_string_view>
              (__return_storage_ptr__,&this->Directory,&local_19,&this->Name,&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFrameworkPath() const
    {
      return this->Directory.empty()
        ? cmStrCat(this->Name, ".framework"_s)
        : cmStrCat(this->Directory, '/', this->Name, ".framework"_s);
    }